

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

uint64_t sum_quotients<short,libdivide::divider<short,(libdivide::Branching)0>>
                   (random_numerators<short> *vals,divider<short,_(libdivide::Branching)0> *div)

{
  byte bVar1;
  ushort uVar2;
  byte bVar3;
  ushort uVar4;
  random_numerators<short> *prVar5;
  short *in_RSI;
  random_numerators<short> *in_RDI;
  const_iterator iter;
  UIntT sum;
  int16_t q_1;
  int16_t sign_1;
  uint16_t uq_1;
  int16_t q;
  uint16_t uq;
  uint16_t mask;
  uint16_t sign;
  uint8_t shift;
  int32_t rl;
  int32_t yl;
  int32_t xl;
  random_numerators<short> *prVar6;
  random_numerators<short> *local_78;
  ushort local_6a;
  short local_22;
  short local_12;
  
  local_6a = 0;
  local_78 = (random_numerators<short> *)random_numerators<short>::begin(in_RDI);
  while( true ) {
    prVar6 = local_78;
    prVar5 = (random_numerators<short> *)random_numerators<short>::end(local_78);
    if (prVar6 == prVar5) break;
    uVar2 = *(ushort *)&local_78->_pData;
    bVar1 = *(byte *)(in_RSI + 1);
    bVar3 = bVar1 & 0x1f;
    if (*in_RSI == 0) {
      uVar4 = (ushort)((int)(char)bVar1 >> 7);
      local_12 = ((ushort)((int)(short)(uVar2 + ((short)uVar2 >> 0xf & (short)(1 << bVar3) - 1U)) >>
                          bVar3) ^ uVar4) - uVar4;
    }
    else {
      local_22 = (short)((uint)((int)(short)uVar2 * (int)*in_RSI) >> 0x10);
      if ((bVar1 & 0x40) != 0) {
        uVar4 = (ushort)((int)(char)bVar1 >> 7);
        local_22 = local_22 + ((uVar2 ^ uVar4) - uVar4);
      }
      local_12 = (short)((int)local_22 >> bVar3);
      local_12 = local_12 + (ushort)(local_12 < 0);
    }
    local_6a = local_6a + local_12;
    local_78 = (random_numerators<short> *)((long)&local_78->_pData + 2);
  }
  return (ulong)local_6a;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}